

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

void __thiscall tinyusdz::usda::USDAReader::Impl::Impl(Impl *this,StreamReader *sr)

{
  StreamReader *sr_local;
  Impl *this_local;
  
  Stage::Stage(&this->_stage);
  ::std::
  stack<tinyusdz::usda::USDAReader::ParseState,std::deque<tinyusdz::usda::USDAReader::ParseState,std::allocator<tinyusdz::usda::USDAReader::ParseState>>>
  ::
  stack<std::deque<tinyusdz::usda::USDAReader::ParseState,std::allocator<tinyusdz::usda::USDAReader::ParseState>>,void>
            ((stack<tinyusdz::usda::USDAReader::ParseState,std::deque<tinyusdz::usda::USDAReader::ParseState,std::allocator<tinyusdz::usda::USDAReader::ParseState>>>
              *)&this->parse_stack);
  ::std::__cxx11::string::string((string *)&this->_base_dir);
  ::std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&this->_path_stack);
  ::std::__cxx11::string::string((string *)&this->_err);
  ::std::__cxx11::string::string((string *)&this->_warn);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_tinyusdz::Layer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_tinyusdz::Layer>_>_>_>
  ::map(&this->_reference_cache);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->_toplevel_prims);
  ::std::
  vector<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
  ::vector(&this->_prim_nodes);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map(&this->_primpath_to_prim_idx_map);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->_toplevel_primspecs);
  ::std::
  vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
  ::vector(&this->_primspec_nodes);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map(&this->_primpath_to_primspec_idx_map);
  this->_primspec_invalidated = false;
  ::std::__cxx11::string::string((string *)&this->_defaultPrim);
  USDAReaderConfig::USDAReaderConfig(&this->_config);
  ascii::AsciiParser::AsciiParser(&this->_parser);
  ascii::AsciiParser::SetStream(&this->_parser,sr);
  return;
}

Assistant:

Impl(StreamReader *sr) { _parser.SetStream(sr); }